

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::GenToString
          (string *__return_storage_ptr__,DartGenerator *this,string *object_name,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  ulong uVar4;
  char *pcVar5;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_148;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong local_d8;
  size_t i;
  string escaped_field;
  string field;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_88;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_29;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_28;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  string *object_name_local;
  DartGenerator *this_local;
  string *code;
  
  local_29 = 0;
  local_28 = non_deprecated_fields;
  non_deprecated_fields_local =
       (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
        *)object_name;
  object_name_local = (string *)this;
  this_local = (DartGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  @override\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  String toString() {\n");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 "    return \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 non_deprecated_fields_local);
  std::operator+(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 "{");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&it);
  local_88._M_current =
       (pair<int,_flatbuffers::FieldDef_*> *)
       std::
       vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
       ::begin(local_28);
  while( true ) {
    field.field_2._8_8_ =
         std::
         vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
         ::end(local_28);
    bVar2 = __gnu_cxx::operator!=
                      (&local_88,
                       (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                        *)((long)&field.field_2 + 8));
    if (!bVar2) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_88);
    IdlNamer::Field_abi_cxx11_
              ((string *)((long)&escaped_field.field_2 + 8),&this->namer_,ppVar3->second);
    std::__cxx11::string::string((string *)&i);
    for (local_d8 = 0; uVar1 = local_d8, uVar4 = std::__cxx11::string::size(), uVar1 < uVar4;
        local_d8 = local_d8 + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)((long)&escaped_field.field_2 + 8));
      if (*pcVar5 == '$') {
        std::__cxx11::string::push_back((char)&i);
      }
      std::__cxx11::string::operator[]((ulong)((long)&escaped_field.field_2 + 8));
      std::__cxx11::string::push_back((char)&i);
    }
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,": ${");
    std::operator+(&local_118,&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&escaped_field.field_2 + 8));
    std::operator+(&local_f8,&local_118,"}");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    local_148._M_current =
         (pair<int,_flatbuffers::FieldDef_*> *)
         std::
         vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
         ::end(local_28);
    local_140 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                ::operator-(&local_148,1);
    bVar2 = __gnu_cxx::operator!=(&local_88,&local_140);
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)(escaped_field.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
    ::operator++(&local_88);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}\';\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  }\n");
  return __return_storage_ptr__;
}

Assistant:

std::string GenToString(
      const std::string &object_name,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields) {
    std::string code;
    code += "  @override\n";
    code += "  String toString() {\n";
    code += "    return '" + object_name + "{";
    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const std::string field = namer_.Field(*it->second);
      // We need to escape the fact that some fields have $ in the name which is
      // also used in symbol/string substitution.
      std::string escaped_field;
      for (size_t i = 0; i < field.size(); i++) {
        if (field[i] == '$') escaped_field.push_back('\\');
        escaped_field.push_back(field[i]);
      }
      code += escaped_field + ": ${" + field + "}";
      if (it != non_deprecated_fields.end() - 1) { code += ", "; }
    }
    code += "}';\n";
    code += "  }\n";
    return code;
  }